

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::Attribute::Attribute<tinyusdz::Token>(Attribute *this,Token *v,bool varying)

{
  Variability *pVVar1;
  bool varying_local;
  Token *v_local;
  Attribute *this_local;
  
  ::std::__cxx11::string::string((string *)this);
  this->_variability = Varying;
  this->_varying_authored = false;
  ::std::__cxx11::string::string((string *)&this->_type_name);
  primvar::PrimVar::PrimVar(&this->_var);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector(&this->_paths);
  AttrMetas::AttrMetas(&this->_metas);
  set_value<tinyusdz::Token>(this,v);
  pVVar1 = variability(this);
  *pVVar1 = (uint)!varying;
  return;
}

Assistant:

Attribute(const T &v, bool varying = true) {
    static_assert((value::TypeId::TYPE_ID_VALUE_BEGIN <=
                   value::TypeTraits<T>::type_id()) &&
                      (value::TypeId::TYPE_ID_VALUE_END >
                       value::TypeTraits<T>::type_id()),
                  "T is not a value type");
    set_value(v);
    variability() = varying ? Variability::Varying : Variability::Uniform;
  }